

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O3

REF_STATUS ref_part_metric(REF_NODE ref_node,char *filename)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  int iVar5;
  REF_STATUS RVar6;
  size_t sVar7;
  FILE *pFVar8;
  REF_DBL *pRVar9;
  long lVar10;
  REF_DBL *__ptr;
  void *pvVar11;
  double dVar12;
  long lVar13;
  undefined8 uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  REF_MPI pRVar18;
  REF_MPI ref_mpi;
  char *pcVar19;
  double dVar20;
  int iVar21;
  ulong uVar22;
  REF_DBL *pRVar23;
  REF_DBL RVar24;
  undefined4 uVar25;
  undefined8 unaff_R15;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  REF_INT version;
  REF_INT dim;
  REF_INT ldim;
  REF_INT dim_1;
  REF_INT type;
  REF_INT ntype;
  REF_BOOL csv_format;
  REF_BOOL solb_format;
  REF_INT type_1;
  REF_INT ntype_1;
  REF_INT nnode;
  REF_INT local;
  char line [1024];
  uint local_63c;
  void *local_638;
  REF_DBL *local_630;
  int local_624;
  int local_620;
  uint local_61c;
  undefined8 local_618;
  uint local_60c;
  undefined8 local_608;
  REF_BOOL local_600;
  REF_BOOL local_5fc;
  REF_DBL *local_5f8;
  ulong local_5f0;
  REF_DBL *local_5e8;
  uint local_5e0;
  int local_5dc;
  REF_DBL *local_5d8;
  undefined8 local_5d0;
  undefined8 local_5c8;
  undefined8 local_5c0;
  undefined8 local_5b8;
  undefined8 local_5b0;
  REF_DBL local_5a8;
  REF_DBL RStack_5a0;
  FILE *local_598;
  undefined8 uStack_590;
  REF_DBL *local_580;
  double local_578 [9];
  REF_DBL local_530;
  REF_DBL RStack_528;
  REF_DBL local_520;
  undefined8 local_518;
  short local_510;
  undefined4 uStack_50e;
  
  local_5fc = 0;
  local_600 = 0;
  local_624 = -1;
  pRVar18 = ref_node->ref_mpi;
  if (pRVar18->id == 0) {
    sVar7 = strlen(filename);
    iVar3 = strcmp(filename + (sVar7 - 5),".solb");
    if (iVar3 == 0) {
      local_5fc = 1;
    }
  }
  uVar4 = ref_mpi_all_or(pRVar18,&local_5fc);
  if (uVar4 != 0) {
    uVar16 = (ulong)uVar4;
    pcVar19 = "bcast";
    uVar14 = 0x82b;
    goto LAB_002015dc;
  }
  pRVar18 = ref_node->ref_mpi;
  if (local_5fc == 0) {
    if (pRVar18->id == 0) {
      sVar7 = strlen(filename);
      iVar3 = strcmp(filename + (sVar7 - 4),".csv");
      if (iVar3 == 0) {
        local_600 = 1;
      }
    }
    uVar4 = ref_mpi_all_or(pRVar18,&local_600);
    if (uVar4 != 0) {
      uVar16 = (ulong)uVar4;
      pcVar19 = "bcast";
      uVar14 = 0x837;
      goto LAB_002015dc;
    }
    pRVar18 = ref_node->ref_mpi;
    if (local_600 == 0) {
      uVar25 = (undefined4)CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
      if (pRVar18->id == 0) {
        pFVar8 = fopen(filename,"r");
        if (pFVar8 == (FILE *)0x0) {
          printf("unable to open %s\n",filename);
          pcVar19 = "unable to open file";
          uVar14 = 0x843;
          goto LAB_002024b2;
        }
        sVar7 = strlen(filename);
        iVar3 = strcmp(filename + (sVar7 - 4),".sol");
        if (iVar3 == 0) {
          local_624 = -1;
          do {
            iVar3 = feof(pFVar8);
            if (iVar3 != 0) {
LAB_0020257c:
              if (local_624 == -1) goto LAB_002033dd;
              pcVar19 = "SolAtVertices keyword missing from .sol metric";
              uVar14 = 0x872;
              goto LAB_00201d52;
            }
            iVar3 = __isoc99_fscanf(pFVar8,"%s",&local_518);
            if (iVar3 != 1) {
              if (iVar3 == -1) goto LAB_0020257c;
              lVar13 = (long)iVar3;
              pcVar19 = "line read failed";
              lVar10 = 1;
              uVar14 = 0x84d;
              goto LAB_00202d3d;
            }
            if ((local_510 == 0x6e &&
                 CONCAT26(local_518._6_2_,(undefined6)local_518) == 0x6f69736e656d6944) &&
               (iVar3 = __isoc99_fscanf(pFVar8,"%d",&local_624), iVar3 != 1)) {
              lVar13 = (long)iVar3;
              pcVar19 = "read dim";
              lVar10 = 1;
              uVar14 = 0x850;
              goto LAB_00202d3d;
            }
          } while (CONCAT44(uStack_50e,CONCAT22(local_510,local_518._6_2_)) != 0x73656369747265 ||
                   CONCAT26(local_518._6_2_,(undefined6)local_518) != 0x72655674416c6f53);
          iVar3 = __isoc99_fscanf(pFVar8,"%d",&local_5d8);
          if (iVar3 != 1) {
            lVar13 = (long)iVar3;
            pcVar19 = "read nnode";
            lVar10 = 1;
            uVar14 = 0x854;
            goto LAB_00202d3d;
          }
          lVar10 = ref_node->old_n_global;
          lVar13 = (long)(int)local_5d8;
          if (lVar10 != lVar13) {
            pcVar19 = "wrong vertex number in .sol";
            uVar14 = 0x856;
            goto LAB_00202d3d;
          }
          iVar3 = __isoc99_fscanf(pFVar8,"%d",&local_608);
          if (iVar3 != 1) {
            lVar13 = (long)iVar3;
            pcVar19 = "read number of types";
            lVar10 = 1;
            uVar14 = 0x857;
            goto LAB_00202d3d;
          }
          if ((int)local_608 < 1) {
            iVar3 = 0;
            if (local_624 != 2) {
LAB_00203403:
              lVar13 = (long)iVar3;
              pcVar19 = "3D expects 6 terms of 3x3 metric";
              lVar10 = 6;
              uVar14 = 0x86a;
              goto LAB_00202d3d;
            }
LAB_00202f86:
            lVar13 = (long)iVar3;
            pcVar19 = "2D expects 3 terms of 2x2 metric";
            lVar10 = 3;
            uVar14 = 0x868;
            goto LAB_00202d3d;
          }
          iVar3 = 0;
          iVar21 = 0;
          do {
            iVar5 = __isoc99_fscanf(pFVar8,"%d",&local_618);
            if (iVar5 != 1) {
              lVar13 = (long)iVar5;
              pcVar19 = "read number of types";
              lVar10 = 1;
              uVar14 = 0x85a;
              goto LAB_00202d3d;
            }
            if (2 < (uint)local_618 - 1) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x85d,"ref_part_metric","only types 1 (scalar) or 3 (tensor)) supported");
              printf(" %d type\n",(ulong)(uint)local_618);
              return 1;
            }
            uVar4 = 0;
            if ((uint)local_618 == 3) {
              if (local_624 == 2) {
                iVar3 = iVar3 + 3;
              }
              else {
                iVar3 = iVar3 + 6;
              }
            }
            else {
              uVar4 = (uint)((uint)local_618 == 1);
              iVar3 = iVar3 + uVar4;
            }
            iVar21 = iVar21 + 1;
          } while (iVar21 < (int)local_608);
          if (local_624 == 2) {
            if (iVar3 != 3) goto LAB_00202f86;
          }
          else if (iVar3 != 6) goto LAB_00203403;
          iVar3 = __isoc99_fscanf(pFVar8,"%*[^1234567890-+.]",(uint)local_618 == 1,uVar4);
          if (iVar3 < 0) {
            pcVar19 = "skip blank line";
            uVar14 = 0x86c;
            goto LAB_00201d52;
          }
          if (local_624 == -1) {
LAB_002033dd:
            pcVar19 = "Dimension keyword missing from .sol metric";
            uVar14 = 0x871;
            goto LAB_00201d52;
          }
          uVar25 = 0;
        }
        else {
          local_5d8 = (REF_DBL *)CONCAT44(local_5d8._4_4_,(int)ref_node->old_n_global);
        }
      }
      else {
        pFVar8 = (FILE *)0x0;
      }
      uVar4 = ref_mpi_bcast(ref_node->ref_mpi,&local_5d8,1,1);
      if (uVar4 == 0) {
        local_638 = (void *)CONCAT44(local_638._4_4_,uVar25);
        iVar3 = (int)local_5d8;
        pRVar23 = (REF_DBL *)(long)(int)local_5d8;
        pRVar18 = ref_node->ref_mpi;
        uVar4 = (int)local_5d8 / pRVar18->n;
        pRVar9 = (REF_DBL *)0x186a0;
        if (100000 < (int)uVar4) {
          pRVar9 = (REF_DBL *)(ulong)uVar4;
        }
        if ((long)pRVar23 <= (long)pRVar9) {
          pRVar9 = pRVar23;
        }
        if ((long)pRVar23 < 0) {
          pcVar19 = "malloc metric of REF_DBL negative";
          uVar14 = 0x87d;
LAB_00201d52:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar14,"ref_part_metric",pcVar19);
          return 1;
        }
        uVar4 = (int)pRVar9 * 6;
        local_630 = (REF_DBL *)malloc((ulong)uVar4 << 3);
        auVar2 = _DAT_00218960;
        if (local_630 == (REF_DBL *)0x0) {
          pcVar19 = "malloc metric of REF_DBL NULL";
          uVar14 = 0x87d;
          local_630 = (REF_DBL *)0x0;
LAB_002024b2:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar14,"ref_part_metric",pcVar19);
          return 2;
        }
        if (iVar3 != 0) {
          uVar16 = 1;
          if (1 < (int)uVar4) {
            uVar16 = (ulong)uVar4;
          }
          lVar10 = uVar16 - 1;
          auVar26._8_4_ = (int)lVar10;
          auVar26._0_8_ = lVar10;
          auVar26._12_4_ = (int)((ulong)lVar10 >> 0x20);
          lVar10 = 0;
          auVar26 = auVar26 ^ _DAT_00218960;
          auVar29 = _DAT_00218950;
          do {
            auVar28 = auVar29 ^ auVar2;
            if ((bool)(~(auVar28._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar28._0_4_ ||
                        auVar26._4_4_ < auVar28._4_4_) & 1)) {
              *(undefined8 *)((long)local_630 + lVar10) = 0xbff0000000000000;
            }
            if ((auVar28._12_4_ != auVar26._12_4_ || auVar28._8_4_ <= auVar26._8_4_) &&
                auVar28._12_4_ <= auVar26._12_4_) {
              *(undefined8 *)((long)local_630 + lVar10 + 8) = 0xbff0000000000000;
            }
            lVar13 = auVar29._8_8_;
            auVar29._0_8_ = auVar29._0_8_ + 2;
            auVar29._8_8_ = lVar13 + 2;
            lVar10 = lVar10 + 0x10;
          } while ((ulong)((int)uVar16 + 1U & 0xfffffffe) << 3 != lVar10);
          local_580 = local_630 + 5;
          local_5a8 = 0.0;
          RStack_5a0 = 1.0;
          uVar15 = 0;
          uVar16 = 0;
          local_60c = uVar4;
          local_5e8 = pRVar9;
          local_598 = pFVar8;
          do {
            pFVar8 = local_598;
            pRVar18 = ref_node->ref_mpi;
            local_5f8 = (REF_DBL *)(ref_node->old_n_global - uVar16);
            if ((long)local_5e8 < (long)local_5f8) {
              local_5f8 = local_5e8;
            }
            local_5f0 = uVar16;
            if (pRVar18->id == 0) {
              if (0 < (int)(uint)local_5f8) {
                uVar16 = (ulong)((uint)local_5f8 & 0x7fffffff);
                pRVar9 = local_580;
                do {
                  if ((char)local_638 == '\0') {
                    if (local_624 == 3) {
                      iVar3 = __isoc99_fscanf(pFVar8,"%lf %lf %lf %lf %lf %lf",pRVar9 + -5,
                                              pRVar9 + -4,pRVar9 + -2,pRVar9 + -3,pRVar9 + -1,pRVar9
                                             );
                      if (iVar3 != 6) {
                        lVar13 = (long)iVar3;
                        pcVar19 = "metric read error";
                        lVar10 = 6;
                        uVar14 = 0x88d;
                        goto LAB_00202d3d;
                      }
                    }
                    else {
                      iVar3 = __isoc99_fscanf(pFVar8,"%lf %lf %lf",pRVar9 + -5,pRVar9 + -4,
                                              pRVar9 + -2);
                      if (iVar3 != 3) {
                        lVar13 = (long)iVar3;
                        pcVar19 = "metric read error";
                        lVar10 = 3;
                        uVar14 = 0x892;
                        goto LAB_00202d3d;
                      }
                      pRVar9[-3] = 0.0;
                      pRVar9[-1] = local_5a8;
                      *pRVar9 = RStack_5a0;
                    }
                  }
                  else {
                    iVar3 = __isoc99_fscanf(pFVar8,"%lf %lf %lf %lf %lf %lf",pRVar9 + -5,pRVar9 + -4
                                            ,pRVar9 + -3,pRVar9 + -2,pRVar9 + -1,pRVar9);
                    if (iVar3 != 6) {
                      lVar13 = (long)iVar3;
                      pcVar19 = "metric read error";
                      lVar10 = 6;
                      uVar14 = 0x89d;
                      goto LAB_00202d3d;
                    }
                  }
                  pRVar9 = pRVar9 + 6;
                  uVar16 = uVar16 - 1;
                } while (uVar16 != 0);
                pRVar18 = ref_node->ref_mpi;
              }
              uVar16 = local_5f0;
              uVar4 = ref_mpi_bcast(pRVar18,local_630,local_60c,3);
              if (uVar4 != 0) {
                pcVar19 = "bcast";
                uVar14 = 0x8a1;
                goto LAB_002026a7;
              }
            }
            else {
              uVar4 = ref_mpi_bcast(pRVar18,local_630,local_60c,3);
              if (uVar4 != 0) {
                pcVar19 = "bcast";
                uVar14 = 0x8a5;
LAB_002026a7:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,uVar14,"ref_part_metric",(ulong)uVar4,pcVar19);
                return uVar4;
              }
            }
            if (0 < (int)(uint)local_5f8) {
              uVar22 = (ulong)((uint)local_5f8 & 0x7fffffff);
              pRVar9 = local_630;
              do {
                uVar4 = ref_node_local(ref_node,uVar16,(REF_INT *)local_578);
                if ((uVar4 != 0) && (uVar4 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x8a9,"ref_part_metric",(ulong)uVar4,"local");
                  uVar15 = uVar4;
                }
                if ((uVar4 != 5) && (uVar4 != 0)) {
                  return uVar15;
                }
                if ((local_578[0]._0_4_ != -1) &&
                   (uVar4 = ref_node_metric_set(ref_node,local_578[0]._0_4_,pRVar9), uVar4 != 0)) {
                  pcVar19 = "set local node met";
                  uVar14 = 0x8ac;
                  goto LAB_002026a7;
                }
                pRVar9 = pRVar9 + 6;
                uVar16 = uVar16 + 1;
                uVar22 = uVar22 - 1;
              } while (uVar22 != 0);
            }
            uVar16 = local_5f0 + (long)(int)local_5f8;
          } while ((long)uVar16 < (long)(int)local_5d8);
          pRVar18 = ref_node->ref_mpi;
          pFVar8 = local_598;
        }
        free(local_630);
        if (pRVar18->id != 0) {
          return 0;
        }
        iVar3 = fclose(pFVar8);
        if (iVar3 == 0) {
          return 0;
        }
        lVar13 = (long)iVar3;
        pcVar19 = "close file";
        uVar14 = 0x8b3;
        lVar10 = 0;
LAB_00202d3d:
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar14,"ref_part_metric",pcVar19,lVar10,lVar13);
        return 1;
      }
      uVar16 = (ulong)uVar4;
      pcVar19 = "bcast nnode";
      uVar14 = 0x878;
      goto LAB_002015dc;
    }
    if (pRVar18->id == 0) {
      pFVar8 = fopen(filename,"r");
      if (pFVar8 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        pcVar19 = "unable to open file";
        uVar14 = 0x7b1;
        goto LAB_00201a66;
      }
      pcVar19 = fgets((char *)&local_518,0x400,pFVar8);
      if ((char *)&local_518 == pcVar19) {
        puts((char *)&local_518);
        local_63c = 0;
        pcVar19 = fgets((char *)&local_518,0x400,pFVar8);
        while ((char *)&local_518 == pcVar19) {
          pcVar19 = strtok((char *)&local_518,",");
          if (pcVar19 != (char *)0x0) {
            iVar3 = 0xc;
            do {
              pcVar19 = strtok((char *)0x0,",");
              iVar3 = iVar3 + -1;
            } while (pcVar19 != (char *)0x0);
            if (iVar3 == 0) {
              local_63c = local_63c + 1;
            }
          }
          pcVar19 = fgets((char *)&local_518,0x400,pFVar8);
        }
        printf("nline %d \n");
        uVar4 = local_63c;
        uVar16 = (ulong)local_63c;
        if (-1 < (int)local_63c) {
          local_630 = (REF_DBL *)malloc(uVar16 * 0x18);
          if (local_630 == (REF_DBL *)0x0) {
            pcVar19 = "malloc xyz of REF_DBL NULL";
            uVar14 = 0x7bf;
          }
          else {
            if (uVar16 != 0) {
              memset(local_630,0,uVar16 * 0x18);
            }
            sVar7 = (ulong)(uVar4 * 6) << 3;
            local_638 = malloc(sVar7);
            if (local_638 != (void *)0x0) {
              if (uVar16 != 0) {
                memset(local_638,0,sVar7);
              }
              iVar3 = fseek(pFVar8,0,0);
              if (iVar3 == 0) {
                pcVar19 = fgets((char *)&local_518,0x400,pFVar8);
                if ((char *)&local_518 == pcVar19) {
                  local_63c = 0;
                  pcVar19 = fgets((char *)&local_518,0x400,pFVar8);
                  while ((char *)&local_518 == pcVar19) {
                    pcVar19 = strtok((char *)&local_518,",");
                    if (pcVar19 != (char *)0x0) {
                      lVar10 = -0x60;
                      do {
                        if (lVar10 == 0) {
                          pcVar19 = "too many col";
                          uVar14 = 0x7c8;
                          goto LAB_00202541;
                        }
                        dVar12 = atof(pcVar19);
                        *(double *)((long)&local_518 + lVar10) = dVar12;
                        pcVar19 = strtok((char *)0x0,",");
                        lVar10 = lVar10 + 8;
                      } while (pcVar19 != (char *)0x0);
                      if (lVar10 == 0) {
                        lVar10 = (long)(int)local_63c;
                        *(double *)((long)local_638 + lVar10 * 0x30) = local_578[0];
                        pdVar1 = (double *)((long)local_638 + (long)(int)(local_63c * 6 + 1) * 8);
                        *pdVar1 = (local_578[3] + local_578[1]) * 0.5;
                        pdVar1[1] = (local_578[6] + local_578[2]) * 0.5;
                        *(double *)((long)local_638 + lVar10 * 0x30 + 0x18) = local_578[4];
                        *(double *)((long)local_638 + lVar10 * 0x30 + 0x20) =
                             (local_578[5] + local_578[7]) * 0.5;
                        *(double *)((long)local_638 + lVar10 * 0x30 + 0x28) = local_578[8];
                        local_630[lVar10 * 3] = local_530;
                        (local_630 + lVar10 * 3)[1] = RStack_528;
                        local_630[lVar10 * 3 + 2] = local_520;
                        local_63c = local_63c + 1;
                      }
                    }
                    pcVar19 = fgets((char *)&local_518,0x400,pFVar8);
                  }
                  fclose(pFVar8);
                  pRVar9 = local_630;
                  pvVar11 = local_638;
                  goto LAB_002012d1;
                }
                pcVar19 = "read header";
                uVar14 = 0x7c2;
              }
              else {
                pcVar19 = "rewind";
                uVar14 = 0x7c1;
              }
              goto LAB_00202541;
            }
            pcVar19 = "malloc metric of REF_DBL NULL";
            uVar14 = 0x7c0;
          }
LAB_00201a66:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar14,"ref_part_metric_csv",pcVar19);
          uVar16 = 2;
          goto LAB_0020254d;
        }
        pcVar19 = "malloc xyz of REF_DBL negative";
        uVar14 = 0x7bf;
      }
      else {
        pcVar19 = "read header";
        uVar14 = 0x7b2;
      }
LAB_00202541:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar14
             ,"ref_part_metric_csv",pcVar19);
      uVar16 = 1;
    }
    else {
      pRVar9 = (REF_DBL *)0x0;
      pvVar11 = (void *)0x0;
LAB_002012d1:
      uVar4 = ref_mpi_bcast(pRVar18,&local_63c,1,1);
      if (uVar4 == 0) {
        uVar16 = (ulong)local_63c;
        if (pRVar18->id != 0) {
          if ((int)local_63c < 0) {
            pcVar19 = "malloc xyz of REF_DBL negative";
            uVar14 = 0x7de;
            goto LAB_00202541;
          }
          iVar3 = local_63c * 3;
          pRVar9 = (REF_DBL *)malloc(uVar16 * 0x18);
          if (pRVar9 == (REF_DBL *)0x0) {
            pcVar19 = "malloc xyz of REF_DBL NULL";
            uVar14 = 0x7de;
          }
          else {
            if (uVar16 != 0) {
              memset(pRVar9,0,uVar16 * 0x18);
            }
            local_638 = malloc(uVar16 * 0x30);
            if (local_638 != (void *)0x0) {
              if (uVar16 == 0) {
                iVar3 = 0;
              }
              else {
                memset(local_638,0,uVar16 * 0x30);
              }
              goto LAB_00201b13;
            }
            pcVar19 = "malloc metric of REF_DBL NULL";
            uVar14 = 0x7df;
          }
          goto LAB_00201a66;
        }
        iVar3 = local_63c * 3;
        local_638 = pvVar11;
LAB_00201b13:
        uVar4 = ref_mpi_bcast(pRVar18,pRVar9,iVar3,3);
        if (uVar4 == 0) {
          uVar4 = ref_mpi_bcast(pRVar18,local_638,local_63c * 6,3);
          if (uVar4 == 0) {
            uVar4 = ref_search_create((REF_SEARCH *)&local_608,local_63c);
            if (uVar4 == 0) {
              uVar4 = ref_list_create((REF_LIST *)&local_618);
              if (uVar4 == 0) {
                if (0 < (int)local_63c) {
                  lVar10 = 0;
                  pRVar23 = pRVar9;
                  do {
                    uVar4 = ref_search_insert((REF_SEARCH)CONCAT44(local_608._4_4_,(int)local_608),
                                              (REF_INT)lVar10,pRVar23,0.0);
                    if (uVar4 != 0) {
                      uVar16 = (ulong)uVar4;
                      pcVar19 = "ins";
                      uVar14 = 0x7ee;
                      goto LAB_00201313;
                    }
                    lVar10 = lVar10 + 1;
                    pRVar23 = pRVar23 + 3;
                  } while (lVar10 < (int)local_63c);
                }
                iVar3 = ref_node->max;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    if (-1 < ref_node->global[lVar10]) {
                      uVar4 = ref_search_touching((REF_SEARCH)
                                                  CONCAT44(local_608._4_4_,(int)local_608),
                                                  (REF_LIST)
                                                  CONCAT44(local_618._4_4_,(uint)local_618),
                                                  ref_node->real + lVar10 * 0xf,1.0);
                      if (uVar4 == 0) {
                        lVar13 = (long)*(int *)CONCAT44(local_618._4_4_,(uint)local_618);
                        if (0 < lVar13) {
                          pRVar23 = ref_node->real;
                          iVar3 = -1;
                          lVar17 = 0;
                          dVar12 = 1e+200;
                          do {
                            iVar21 = *(int *)(*(long *)((int *)CONCAT44(local_618._4_4_,
                                                                        (uint)local_618) + 2) +
                                             lVar17 * 4);
                            dVar20 = SQRT((pRVar23[lVar10 * 0xf + 2] -
                                          pRVar9[(long)(iVar21 * 3) + 2]) *
                                          (pRVar23[lVar10 * 0xf + 2] -
                                          pRVar9[(long)(iVar21 * 3) + 2]) +
                                          (pRVar23[lVar10 * 0xf + 1] -
                                          pRVar9[(long)(iVar21 * 3) + 1]) *
                                          (pRVar23[lVar10 * 0xf + 1] -
                                          pRVar9[(long)(iVar21 * 3) + 1]) +
                                          (pRVar23[lVar10 * 0xf] - pRVar9[(long)iVar21 * 3]) *
                                          (pRVar23[lVar10 * 0xf] - pRVar9[(long)iVar21 * 3]));
                            if (dVar12 <= dVar20) {
                              dVar20 = dVar12;
                              iVar21 = iVar3;
                            }
                            iVar3 = iVar21;
                            lVar17 = lVar17 + 1;
                            dVar12 = dVar20;
                          } while (lVar13 != lVar17);
                          if (iVar3 != -1) {
                            lVar13 = (long)(iVar3 * 6);
                            local_5d8 = *(REF_DBL **)((long)local_638 + lVar13 * 8);
                            local_5d0 = *(undefined8 *)((long)local_638 + (long)(iVar3 * 6 + 1) * 8)
                            ;
                            local_5c8 = *(undefined8 *)((long)local_638 + lVar13 * 8 + 0x10);
                            local_5c0 = *(undefined8 *)((long)local_638 + lVar13 * 8 + 0x18);
                            local_5b8 = *(undefined8 *)((long)local_638 + lVar13 * 8 + 0x20);
                            local_5b0 = *(undefined8 *)((long)local_638 + lVar13 * 8 + 0x28);
                            uVar4 = ref_node_metric_set(ref_node,(REF_INT)lVar10,
                                                        (REF_DBL *)&local_5d8);
                            if (uVar4 == 0) {
                              uVar4 = ref_list_erase((REF_LIST)
                                                     CONCAT44(local_618._4_4_,(uint)local_618));
                              if (uVar4 == 0) {
                                iVar3 = ref_node->max;
                                goto LAB_00202bc7;
                              }
                              uVar16 = (ulong)uVar4;
                              pcVar19 = "erase";
                              uVar14 = 0x80a;
                            }
                            else {
                              uVar16 = (ulong)uVar4;
                              pcVar19 = "set local node met";
                              uVar14 = 0x809;
                            }
                            goto LAB_00201313;
                          }
                        }
                        pcVar19 = "best not found";
                        uVar14 = 0x802;
                        goto LAB_00202541;
                      }
                      uVar16 = (ulong)uVar4;
                      pcVar19 = "search tree";
                      uVar14 = 0x7f4;
                      goto LAB_00201313;
                    }
LAB_00202bc7:
                    lVar10 = lVar10 + 1;
                  } while (lVar10 < iVar3);
                }
                uVar4 = ref_list_free((REF_LIST)CONCAT44(local_618._4_4_,(uint)local_618));
                if (uVar4 == 0) {
                  uVar4 = ref_search_free((REF_SEARCH)CONCAT44(local_608._4_4_,(int)local_608));
                  if (uVar4 == 0) {
                    if (pRVar9 != (REF_DBL *)0x0) {
                      free(pRVar9);
                    }
                    if (local_638 == (void *)0x0) {
                      return 0;
                    }
                    free(local_638);
                    return 0;
                  }
                  uVar16 = (ulong)uVar4;
                  pcVar19 = "free search";
                  uVar14 = 0x80d;
                }
                else {
                  uVar16 = (ulong)uVar4;
                  pcVar19 = "free list";
                  uVar14 = 0x80c;
                }
              }
              else {
                uVar16 = (ulong)uVar4;
                pcVar19 = "touching list";
                uVar14 = 0x7eb;
              }
            }
            else {
              uVar16 = (ulong)uVar4;
              pcVar19 = "create search";
              uVar14 = 0x7ea;
            }
          }
          else {
            uVar16 = (ulong)uVar4;
            pcVar19 = "bcast metric";
            uVar14 = 0x7e2;
          }
        }
        else {
          uVar16 = (ulong)uVar4;
          pcVar19 = "bcast xyz";
          uVar14 = 0x7e1;
        }
      }
      else {
        uVar16 = (ulong)uVar4;
        pcVar19 = "bcast line";
        uVar14 = 0x7dc;
      }
LAB_00201313:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar14
             ,"ref_part_metric_csv",uVar16,pcVar19);
    }
LAB_0020254d:
    pcVar19 = "part metric .csv";
    uVar14 = 0x83a;
    goto LAB_002015dc;
  }
  local_578[0] = -NAN;
  if (pRVar18->id != 0) {
    pFVar8 = (FILE *)0x0;
    goto LAB_0020116f;
  }
  uVar4 = ref_import_meshb_header(filename,(REF_INT *)&local_63c,&local_518);
  if (uVar4 != 0) {
    uVar16 = (ulong)uVar4;
    pcVar19 = "header";
    uVar14 = 0x722;
    goto LAB_002015b4;
  }
  if (2 < local_63c - 2) {
    pcVar19 = "unsupported version";
    uVar14 = 0x723;
    goto LAB_0020146c;
  }
  pFVar8 = fopen(filename,"r");
  if (pFVar8 == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    pcVar19 = "unable to open file";
    uVar14 = 0x726;
LAB_0020167a:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar14,
           "ref_part_metric_solb",pcVar19);
    uVar16 = 2;
  }
  else {
    uVar4 = ref_import_meshb_jump
                      ((FILE *)pFVar8,local_63c,&local_518,3,(REF_BOOL *)&local_618,
                       (REF_FILEPOS *)local_578);
    if (uVar4 != 0) {
      uVar16 = (ulong)uVar4;
      pcVar19 = "jump";
      uVar14 = 0x729;
      goto LAB_002015b4;
    }
    if ((uint)local_618 == 0) {
      pcVar19 = "solb missing dimension";
      uVar14 = 0x72a;
LAB_0020146c:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar14
             ,"ref_part_metric_solb",pcVar19);
    }
    else {
      dVar12 = (double)fread(&local_61c,4,1,pFVar8);
      if (dVar12 == 4.94065645841247e-324) {
        if ((local_61c & 0xfffffffe) == 2) {
          uVar4 = ref_import_meshb_jump
                            ((FILE *)pFVar8,local_63c,&local_518,0x3e,(REF_BOOL *)&local_618,
                             (REF_FILEPOS *)local_578);
          if (uVar4 == 0) {
            if ((uint)local_618 == 0) {
              pcVar19 = "SolAtVertices missing";
              uVar14 = 0x730;
              goto LAB_0020146c;
            }
            RVar6 = ref_part_meshb_long((FILE *)pFVar8,local_63c,(REF_LONG *)&local_5d8);
            if (RVar6 == 0) {
              dVar12 = (double)fread(&local_5dc,4,1,pFVar8);
              if (dVar12 != 4.94065645841247e-324) {
                pcVar19 = "ntype";
                dVar20 = 4.94065645841247e-324;
                uVar14 = 0x732;
                goto LAB_002024ee;
              }
              local_620 = 0;
              iVar3 = local_5dc;
              if (local_5dc < 1) {
                if (local_61c != 2) {
LAB_0020349d:
                  dVar12 = (double)(long)local_620;
                  pcVar19 = "3D expects 6 terms of 3x3 metric";
                  dVar20 = 2.96439387504748e-323;
                  uVar14 = 0x745;
                  goto LAB_002024ee;
                }
LAB_00203257:
                dVar12 = (double)(long)local_620;
                pcVar19 = "2D expects 3 terms of 2x2 metric";
                dVar20 = 1.48219693752374e-323;
                uVar14 = 0x743;
                goto LAB_002024ee;
              }
              do {
                dVar12 = (double)fread(&local_5e0,4,1,pFVar8);
                if (dVar12 != 4.94065645841247e-324) {
                  pcVar19 = "type";
                  dVar20 = 4.94065645841247e-324;
                  uVar14 = 0x735;
                  goto LAB_002024ee;
                }
                if (2 < local_5e0 - 1) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x738,"ref_part_metric_solb",
                         "only types 1 (scalar) or 3 (tensor)) supported");
                  printf(" %d type\n",(ulong)local_5e0);
                  goto LAB_00201473;
                }
                if (local_5e0 == 3) {
                  if (local_61c == 2) {
                    local_620 = local_620 + 3;
                  }
                  else {
                    local_620 = local_620 + 6;
                  }
                }
                else if (local_5e0 == 1) {
                  local_620 = local_620 + 1;
                }
                iVar3 = iVar3 + -1;
              } while (iVar3 != 0);
              if (local_61c == 2) {
                if (local_620 != 3) goto LAB_00203257;
              }
              else if (local_620 != 6) goto LAB_0020349d;
LAB_0020116f:
              uVar4 = ref_mpi_bcast(ref_node->ref_mpi,&local_63c,1,1);
              if (uVar4 == 0) {
                uVar4 = ref_mpi_bcast(ref_node->ref_mpi,&local_61c,1,1);
                if (uVar4 == 0) {
                  uVar4 = ref_mpi_bcast(ref_node->ref_mpi,&local_5d8,1,2);
                  if (uVar4 == 0) {
                    uVar4 = ref_mpi_bcast(ref_node->ref_mpi,&local_620,1,2);
                    pRVar9 = local_5d8;
                    if (uVar4 == 0) {
                      pRVar23 = (REF_DBL *)ref_node->old_n_global;
                      if ((local_5d8 == pRVar23) || ((REF_DBL *)((long)local_5d8 / 2) == pRVar23)) {
                        lVar10 = (long)local_5d8 / (long)ref_node->ref_mpi->n;
                        pRVar23 = (REF_DBL *)(long)(int)lVar10;
                        if (lVar10 < 100000) {
                          pRVar23 = (REF_DBL *)0x186a0;
                        }
                        if ((long)local_5d8 <= (long)pRVar23) {
                          pRVar23 = local_5d8;
                        }
                        iVar3 = (int)pRVar23;
                        if (-1 < iVar3) {
                          uVar4 = iVar3 * 6;
                          __ptr = (REF_DBL *)malloc((ulong)uVar4 << 3);
                          auVar2 = _DAT_00218960;
                          if (__ptr == (REF_DBL *)0x0) {
                            pcVar19 = "malloc metric of REF_DBL NULL";
                            uVar14 = 0x75d;
                            goto LAB_0020167a;
                          }
                          if (iVar3 != 0) {
                            uVar16 = 1;
                            if (1 < (int)uVar4) {
                              uVar16 = (ulong)uVar4;
                            }
                            lVar10 = uVar16 - 1;
                            auVar27._8_4_ = (int)lVar10;
                            auVar27._0_8_ = lVar10;
                            auVar27._12_4_ = (int)((ulong)lVar10 >> 0x20);
                            lVar10 = 0;
                            auVar27 = auVar27 ^ _DAT_00218960;
                            auVar28 = _DAT_00218950;
                            do {
                              auVar29 = auVar28 ^ auVar2;
                              if ((bool)(~(auVar29._4_4_ == auVar27._4_4_ &&
                                           auVar27._0_4_ < auVar29._0_4_ ||
                                          auVar27._4_4_ < auVar29._4_4_) & 1)) {
                                *(undefined8 *)((long)__ptr + lVar10) = 0xbff0000000000000;
                              }
                              if ((auVar29._12_4_ != auVar27._12_4_ ||
                                  auVar29._8_4_ <= auVar27._8_4_) &&
                                  auVar29._12_4_ <= auVar27._12_4_) {
                                *(undefined8 *)((long)__ptr + lVar10 + 8) = 0xbff0000000000000;
                              }
                              lVar13 = auVar28._8_8_;
                              auVar28._0_8_ = auVar28._0_8_ + 2;
                              auVar28._8_8_ = lVar13 + 2;
                              lVar10 = lVar10 + 0x10;
                            } while ((ulong)((int)uVar16 + 1U & 0xfffffffe) << 3 != lVar10);
                          }
                          local_60c = uVar4;
                          if (0 < (long)pRVar9) {
                            local_598 = (FILE *)0x0;
                            uStack_590 = 0x3ff0000000000000;
                            uVar16 = 0;
                            RVar24 = 0.0;
                            local_630 = __ptr;
                            local_5e8 = pRVar23;
                            do {
                              pRVar23 = local_630;
                              uVar4 = (int)pRVar9 - SUB84(RVar24,0);
                              local_5f0 = (ulong)uVar4;
                              if ((int)local_5e8 < (int)uVar4) {
                                local_5f0 = (ulong)local_5e8 & 0xffffffff;
                              }
                              ref_mpi = ref_node->ref_mpi;
                              local_5a8 = RVar24;
                              if (ref_mpi->id == 0) {
                                if (0 < (int)local_5f0) {
                                  local_638 = (void *)(local_5f0 * 0x30);
                                  pvVar11 = (void *)0x0;
                                  do {
                                    if (local_620 == 3) {
                                      dVar12 = (double)fread((void *)((long)pRVar23 + (long)pvVar11)
                                                             ,8,1,pFVar8);
                                      if (dVar12 != 4.94065645841247e-324) {
                                        pcVar19 = "m11";
                                        dVar20 = 4.94065645841247e-324;
                                        uVar14 = 0x774;
                                        goto LAB_002024ee;
                                      }
                                      dVar12 = (double)fread((void *)((long)pRVar23 + (long)pvVar11
                                                                     + 8),8,1,pFVar8);
                                      if (dVar12 != 4.94065645841247e-324) {
                                        pcVar19 = "m12";
                                        dVar20 = 4.94065645841247e-324;
                                        uVar14 = 0x776;
                                        goto LAB_002024ee;
                                      }
                                      dVar12 = (double)fread((void *)((long)pRVar23 + (long)pvVar11
                                                                     + 0x18),8,1,pFVar8);
                                      if (dVar12 != 4.94065645841247e-324) {
                                        pcVar19 = "m22";
                                        dVar20 = 4.94065645841247e-324;
                                        uVar14 = 0x778;
                                        goto LAB_002024ee;
                                      }
                                      *(undefined8 *)((long)(pRVar23 + 2) + (long)pvVar11) = 0;
                                      *(undefined8 *)((long)(pRVar23 + 4) + (long)pvVar11) =
                                           local_598;
                                      ((undefined8 *)((long)(pRVar23 + 4) + (long)pvVar11))[1] =
                                           uStack_590;
                                    }
                                    else {
                                      if (local_620 != 6) {
                                        pcVar19 = "not a 2D or 3D ldim";
                                        uVar14 = 0x77d;
                                        goto LAB_0020146c;
                                      }
                                      dVar12 = (double)fread((void *)((long)pRVar23 + (long)pvVar11)
                                                             ,8,1,pFVar8);
                                      if (dVar12 != 4.94065645841247e-324) {
                                        pcVar19 = "m11";
                                        dVar20 = 4.94065645841247e-324;
                                        uVar14 = 0x766;
                                        goto LAB_002024ee;
                                      }
                                      dVar12 = (double)fread((void *)((long)pRVar23 + (long)pvVar11
                                                                     + 8),8,1,pFVar8);
                                      if (dVar12 != 4.94065645841247e-324) {
                                        pcVar19 = "m12";
                                        dVar20 = 4.94065645841247e-324;
                                        uVar14 = 0x768;
                                        goto LAB_002024ee;
                                      }
                                      dVar12 = (double)fread((void *)((long)pRVar23 + (long)pvVar11
                                                                     + 0x18),8,1,pFVar8);
                                      if (dVar12 != 4.94065645841247e-324) {
                                        pcVar19 = "m22";
                                        dVar20 = 4.94065645841247e-324;
                                        uVar14 = 0x76b;
                                        goto LAB_002024ee;
                                      }
                                      dVar12 = (double)fread((void *)((long)pRVar23 + (long)pvVar11
                                                                     + 0x10),8,1,pFVar8);
                                      if (dVar12 != 4.94065645841247e-324) {
                                        pcVar19 = "m31";
                                        dVar20 = 4.94065645841247e-324;
                                        uVar14 = 0x76d;
                                        goto LAB_002024ee;
                                      }
                                      dVar12 = (double)fread((void *)((long)pRVar23 + (long)pvVar11
                                                                     + 0x20),8,1,pFVar8);
                                      if (dVar12 != 4.94065645841247e-324) {
                                        pcVar19 = "m32";
                                        dVar20 = 4.94065645841247e-324;
                                        uVar14 = 0x76f;
                                        goto LAB_002024ee;
                                      }
                                      dVar12 = (double)fread((void *)((long)pRVar23 + (long)pvVar11
                                                                     + 0x28),8,1,pFVar8);
                                      if (dVar12 != 4.94065645841247e-324) {
                                        pcVar19 = "m33";
                                        dVar20 = 4.94065645841247e-324;
                                        uVar14 = 0x771;
                                        goto LAB_002024ee;
                                      }
                                    }
                                    pvVar11 = (void *)((long)pvVar11 + 0x30);
                                  } while (local_638 != pvVar11);
                                  ref_mpi = ref_node->ref_mpi;
                                }
                                uVar4 = ref_mpi_bcast(ref_mpi,pRVar23,local_60c,3);
                                if (uVar4 == 0) goto LAB_002022a0;
                                pcVar19 = "bcast";
                                uVar14 = 0x782;
LAB_00203482:
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                       ,uVar14,"ref_part_metric_solb",(ulong)uVar4,pcVar19);
                                uVar16 = (ulong)uVar4;
                                goto LAB_002015bb;
                              }
                              uVar4 = ref_mpi_bcast(ref_mpi,local_630,local_60c,3);
                              if (uVar4 != 0) {
                                pcVar19 = "bcast";
                                uVar14 = 0x786;
                                goto LAB_00203482;
                              }
LAB_002022a0:
                              if (0 < (int)local_5f0) {
                                pvVar11 = (void *)(local_5f0 & 0xffffffff);
                                local_5f8 = local_630;
                                RVar24 = local_5a8;
                                do {
                                  local_638 = pvVar11;
                                  uVar4 = ref_node_local(ref_node,(REF_GLOB)RVar24,
                                                         (REF_INT *)&local_608);
                                  if ((uVar4 != 0) && (uVar4 != 5)) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                           ,0x78a,"ref_part_metric_solb",(ulong)uVar4,"local");
                                    uVar16 = (ulong)uVar4;
                                  }
                                  if ((uVar4 != 5) && (uVar4 != 0)) {
LAB_0020296c:
                                    if ((int)uVar16 == 0) {
                                      return 0;
                                    }
                                    goto LAB_002015bb;
                                  }
                                  if (((int)local_608 != -1) &&
                                     (uVar4 = ref_node_metric_set(ref_node,(int)local_608,local_5f8)
                                     , uVar4 != 0)) {
                                    pcVar19 = "set local node met";
                                    uVar14 = 0x78d;
                                    goto LAB_00203482;
                                  }
                                  if (local_61c == 2) {
                                    uVar4 = ref_node_local(ref_node,(long)local_5d8 + (long)RVar24,
                                                           (REF_INT *)&local_608);
                                    if ((uVar4 != 0) && (uVar4 != 5)) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x791,"ref_part_metric_solb",(ulong)uVar4,"local");
                                      uVar16 = (ulong)uVar4;
                                    }
                                    if ((uVar4 != 5) && (uVar4 != 0)) goto LAB_0020296c;
                                    if (((int)local_608 != -1) &&
                                       (uVar4 = ref_node_metric_set(ref_node,(int)local_608,
                                                                    local_5f8), uVar4 != 0)) {
                                      pcVar19 = "set local node met";
                                      uVar14 = 0x794;
                                      goto LAB_00203482;
                                    }
                                  }
                                  local_5f8 = local_5f8 + 6;
                                  RVar24 = (REF_DBL)((long)RVar24 + 1);
                                  pvVar11 = (void *)((long)local_638 + -1);
                                } while (pvVar11 != (void *)0x0);
                              }
                              RVar24 = (REF_DBL)((long)local_5a8 + (long)(int)local_5f0);
                              __ptr = local_630;
                              pRVar9 = local_5d8;
                            } while ((long)RVar24 < (long)local_5d8);
                          }
                          free(__ptr);
                          dVar20 = local_578[0];
                          if (pRVar18->id != 0) {
                            return 0;
                          }
                          dVar12 = (double)ftello(pFVar8);
                          if (dVar20 == dVar12) {
                            iVar3 = fclose(pFVar8);
                            if (iVar3 == 0) {
                              return 0;
                            }
                            dVar12 = (double)(long)iVar3;
                            pcVar19 = "close file";
                            uVar14 = 0x79e;
                            dVar20 = 0.0;
                          }
                          else {
                            pcVar19 = "end location";
                            uVar14 = 0x79d;
                          }
                          goto LAB_002024ee;
                        }
                        pcVar19 = "malloc metric of REF_DBL negative";
                        uVar14 = 0x75d;
                      }
                      else {
                        if (pRVar18->id == 0) {
                          printf("file %ld ref_node %ld %s\n",local_5d8,pRVar23,filename);
                        }
                        pcVar19 = "global count mismatch";
                        uVar14 = 0x756;
                      }
                      goto LAB_0020146c;
                    }
                    uVar16 = (ulong)uVar4;
                    pcVar19 = "bcast ldim";
                    uVar14 = 0x74f;
                  }
                  else {
                    uVar16 = (ulong)uVar4;
                    pcVar19 = "bcast nnode";
                    uVar14 = 0x74d;
                  }
                }
                else {
                  uVar16 = (ulong)uVar4;
                  pcVar19 = "bcast dim";
                  uVar14 = 0x74b;
                }
              }
              else {
                uVar16 = (ulong)uVar4;
                pcVar19 = "bcast version";
                uVar14 = 0x749;
              }
            }
            else {
              pcVar19 = "nnode";
              uVar14 = 0x731;
              uVar16 = 1;
            }
          }
          else {
            uVar16 = (ulong)uVar4;
            pcVar19 = "jump";
            uVar14 = 0x72f;
          }
LAB_002015b4:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar14,"ref_part_metric_solb",uVar16,pcVar19);
          goto LAB_002015bb;
        }
        pcVar19 = "unsupported dimension";
        uVar14 = 0x72c;
        goto LAB_0020146c;
      }
      pcVar19 = "dim";
      dVar20 = 4.94065645841247e-324;
      uVar14 = 0x72b;
LAB_002024ee:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar14
             ,"ref_part_metric_solb",pcVar19,dVar20,dVar12);
    }
LAB_00201473:
    uVar16 = 1;
  }
LAB_002015bb:
  pcVar19 = "part metric .solb";
  uVar14 = 0x82e;
LAB_002015dc:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar14,
         "ref_part_metric",uVar16,pcVar19);
  return (REF_STATUS)uVar16;
}

Assistant:

REF_FCN REF_STATUS ref_part_metric(REF_NODE ref_node, const char *filename) {
  FILE *file;
  REF_INT chunk;
  REF_DBL *metric;
  REF_INT section_size;
  REF_GLOB nnode_read, global;
  REF_INT node, local;
  size_t end_of_string;
  REF_BOOL sol_format, found_keyword;
  REF_INT nnode, ntype, type;
  REF_INT ldim, i;
  REF_INT status;
  char line[1024];
  REF_BOOL solb_format = REF_FALSE;
  REF_BOOL csv_format = REF_FALSE;
  REF_INT dim = REF_EMPTY;

  if (ref_mpi_once(ref_node_mpi(ref_node))) {
    end_of_string = strlen(filename);
    if (strcmp(&filename[end_of_string - 5], ".solb") == 0)
      solb_format = REF_TRUE;
  }
  RSS(ref_mpi_all_or(ref_node_mpi(ref_node), &solb_format), "bcast");

  if (solb_format) {
    RSS(ref_part_metric_solb(ref_node, filename), "part metric .solb");
    return REF_SUCCESS;
  }

  if (ref_mpi_once(ref_node_mpi(ref_node))) {
    end_of_string = strlen(filename);
    if (strcmp(&filename[end_of_string - 4], ".csv") == 0)
      csv_format = REF_TRUE;
  }
  RSS(ref_mpi_all_or(ref_node_mpi(ref_node), &csv_format), "bcast");

  if (csv_format) {
    RSS(ref_part_metric_csv(ref_node, filename), "part metric .csv");
    return REF_SUCCESS;
  }

  file = NULL;
  sol_format = REF_FALSE;
  if (ref_mpi_once(ref_node_mpi(ref_node))) {
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    end_of_string = strlen(filename);
    if (strcmp(&filename[end_of_string - 4], ".sol") == 0) {
      sol_format = REF_TRUE;
      found_keyword = REF_FALSE;
      dim = REF_EMPTY;
      while (!feof(file)) {
        status = fscanf(file, "%s", line);
        if (EOF == status) break;
        REIS(1, status, "line read failed");

        if (0 == strcmp("Dimension", line)) {
          REIS(1, fscanf(file, "%d", &dim), "read dim");
        }

        if (0 == strcmp("SolAtVertices", line)) {
          REIS(1, fscanf(file, "%d", &nnode), "read nnode");
          REIS(ref_node_n_global(ref_node), nnode,
               "wrong vertex number in .sol");
          REIS(1, fscanf(file, "%d", &ntype), "read number of types");
          ldim = 0;
          for (i = 0; i < ntype; i++) {
            REIS(1, fscanf(file, "%d", &type), "read number of types");
            RAB(1 <= type && type <= 3,
                "only types 1 (scalar) or 3 (tensor)) supported",
                { printf(" %d type\n", type); });
            if (1 == type) ldim += 1;
            if (3 == type) {
              if (2 == dim) {
                ldim += 3;
              } else {
                ldim += 6;
              }
            }
          }
          if (2 == dim) {
            REIS(3, ldim, "2D expects 3 terms of 2x2 metric");
          } else {
            REIS(6, ldim, "3D expects 6 terms of 3x3 metric");
          }
          RAS(0 <= fscanf(file, "%*[^1234567890-+.]"), "skip blank line");
          found_keyword = REF_TRUE;
          break;
        }
      }
      RUS(REF_EMPTY, dim, "Dimension keyword missing from .sol metric");
      RAS(found_keyword, "SolAtVertices keyword missing from .sol metric");
    } else {
      nnode = (REF_INT)ref_node_n_global(ref_node);
    }
  }
  RSS(ref_mpi_bcast(ref_node_mpi(ref_node), &nnode, 1, REF_INT_TYPE),
      "bcast nnode");

  chunk = (REF_INT)MAX(100000, nnode / ref_mpi_n(ref_node_mpi(ref_node)));
  chunk = (REF_INT)MIN((REF_GLOB)chunk, nnode);

  ref_malloc_init(metric, 6 * chunk, REF_DBL, -1.0);

  nnode_read = 0;
  while (nnode_read < nnode) {
    section_size =
        (REF_INT)MIN((REF_GLOB)chunk, ref_node_n_global(ref_node) - nnode_read);
    if (ref_mpi_once(ref_node_mpi(ref_node))) {
      for (node = 0; node < section_size; node++)
        if (sol_format) {
          if (3 == dim) {
            REIS(6,
                 fscanf(file, "%lf %lf %lf %lf %lf %lf",
                        &(metric[0 + 6 * node]), &(metric[1 + 6 * node]),
                        &(metric[3 + 6 * node]), /* transposed 3,2 */
                        &(metric[2 + 6 * node]), &(metric[4 + 6 * node]),
                        &(metric[5 + 6 * node])),
                 "metric read error");
          } else {
            REIS(3,
                 fscanf(file, "%lf %lf %lf", &(metric[0 + 6 * node]),
                        &(metric[1 + 6 * node]), &(metric[3 + 6 * node])),
                 "metric read error");
            metric[2 + 6 * node] = 0.0; /* m13 */
            metric[4 + 6 * node] = 0.0; /* m23 */
            metric[5 + 6 * node] = 1.0; /* m33 */
          }
        } else {
          REIS(6,
               fscanf(file, "%lf %lf %lf %lf %lf %lf", &(metric[0 + 6 * node]),
                      &(metric[1 + 6 * node]), &(metric[2 + 6 * node]),
                      &(metric[3 + 6 * node]), &(metric[4 + 6 * node]),
                      &(metric[5 + 6 * node])),
               "metric read error");
        }
      RSS(ref_mpi_bcast(ref_node_mpi(ref_node), metric, 6 * chunk,
                        REF_DBL_TYPE),
          "bcast");
    } else {
      RSS(ref_mpi_bcast(ref_node_mpi(ref_node), metric, 6 * chunk,
                        REF_DBL_TYPE),
          "bcast");
    }
    for (node = 0; node < section_size; node++) {
      global = node + nnode_read;
      RXS(ref_node_local(ref_node, global, &local), REF_NOT_FOUND, "local");
      if (REF_EMPTY != local) {
        RSS(ref_node_metric_set(ref_node, local, &(metric[6 * node])),
            "set local node met");
      }
    }
    nnode_read += section_size;
  }

  ref_free(metric);
  if (ref_mpi_once(ref_node_mpi(ref_node))) REIS(0, fclose(file), "close file");

  return REF_SUCCESS;
}